

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::(anonymous_namespace)::GetZeroEnumNameForFlagType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FlagType flag_type)

{
  LogMessage *other;
  allocator local_62;
  LogFinisher local_61;
  LogMessage local_60;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  string *psStack_10;
  FlagType flag_type_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"GPBDescriptorInitializationFlag_None",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"GPBExtensionNone",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (local_14 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"GPBFieldNone",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
               ,0x116);
    other = internal::LogMessage::operator<<(&local_60,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_62);
    std::allocator<char>::~allocator((allocator<char> *)&local_62);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetZeroEnumNameForFlagType(const FlagType flag_type) {
  switch(flag_type) {
    case FLAGTYPE_DESCRIPTOR_INITIALIZATION:
      return "GPBDescriptorInitializationFlag_None";
    case FLAGTYPE_EXTENSION:
      return "GPBExtensionNone";
    case FLAGTYPE_FIELD:
      return "GPBFieldNone";
    default:
      GOOGLE_LOG(FATAL) << "Can't get here.";
      return "0";
  }
}